

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

Hop_Obj_t * Hop_ObjCreatePi(Hop_Man_t *p)

{
  int iVar1;
  Hop_Obj_t *Entry;
  Hop_Obj_t *pObj;
  Hop_Man_t *p_local;
  
  Entry = Hop_ManFetchMemory(p);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0xfffffff8 | 2;
  iVar1 = Vec_PtrSize(p->vPis);
  (Entry->field_1).PioNum = iVar1;
  Vec_PtrPush(p->vPis,Entry);
  p->nObjs[2] = p->nObjs[2] + 1;
  return Entry;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates primary input.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Hop_Obj_t * Hop_ObjCreatePi( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = AIG_PI;
    pObj->PioNum = Vec_PtrSize( p->vPis );
    Vec_PtrPush( p->vPis, pObj );
    p->nObjs[AIG_PI]++;
    return pObj;
}